

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O1

filename_representations * filename_representations_new(char *raw,int type)

{
  filename_representations *pfVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  pfVar1 = (filename_representations *)g_malloc(0x20);
  pfVar1->type = type;
  pcVar2 = (char *)g_strdup(raw);
  pfVar1->raw = pcVar2;
  pcVar2 = realpath(pcVar2,(char *)0x0);
  uVar3 = g_filename_display_name(pcVar2);
  pcVar4 = (char *)g_utf8_collate_key_for_filename(uVar3,0xffffffffffffffff);
  pfVar1->collate_key = pcVar4;
  pcVar4 = (char *)g_strescape(uVar3,strescape_exceptions);
  pfVar1->display = pcVar4;
  g_free(uVar3);
  g_free(pcVar2);
  return pfVar1;
}

Assistant:

static struct filename_representations
*filename_representations_new(const char *raw, int type)
{
    struct filename_representations *fr;
    char *display_pre;
    char *real_path;
#ifdef G_OS_WIN32
    DWORD buffer_length;
    gunichar2 *raw_utf16, *real_path_utf16;
#endif

    fr = g_malloc(sizeof(struct filename_representations));
    fr->type = type;
    fr->raw = g_strdup(raw);

#ifdef G_OS_WIN32
    raw_utf16 = g_utf8_to_utf16(fr->raw, -1, NULL, NULL, NULL);
    buffer_length = GetFullPathNameW(raw_utf16, 0, NULL, NULL);
    real_path_utf16 = g_malloc(buffer_length * sizeof(gunichar2));
    GetFullPathNameW(raw_utf16, buffer_length, real_path_utf16, NULL);
    real_path = g_utf16_to_utf8(raw_utf16, -1, NULL, NULL, NULL);
    g_free(real_path_utf16);
    g_free(raw_utf16);
#else
    real_path = realpath(fr->raw, NULL);
#endif
    display_pre = g_filename_display_name(real_path);
    fr->collate_key = g_utf8_collate_key_for_filename(display_pre, -1);

    fr->display = g_strescape(display_pre,
                              (const gchar *) strescape_exceptions);
    g_free(display_pre);
    g_free(real_path);
    return fr;
}